

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialnonce.cpp
# Opt level: O0

void __thiscall
ConfidentialNonce_Constractor_bytedata33_Test::TestBody
          (ConfidentialNonce_Constractor_bytedata33_Test *this)

{
  bool bVar1;
  byte bVar2;
  char *pcVar3;
  AssertHelper local_138;
  Message local_130;
  bool local_122;
  bool local_121;
  undefined1 local_120 [8];
  AssertionResult gtest_ar_2;
  Message local_108;
  int local_fc;
  ByteData local_f8;
  unsigned_long local_e0;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar_1;
  Message local_c0;
  string local_b8 [32];
  undefined1 local_98 [8];
  AssertionResult gtest_ar;
  ConfidentialNonce nonce;
  allocator local_49;
  string local_48 [32];
  undefined1 local_28 [8];
  ByteData bytedata;
  ConfidentialNonce_Constractor_bytedata33_Test *this_local;
  
  bytedata.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_48,"02c384a78ae89b9600a8d2b4ddb3090ba5dad224ff4b85e6868f2916ca64314ad9",&local_49
            );
  cfd::core::ByteData::ByteData((ByteData *)local_28,local_48);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  cfd::core::ConfidentialNonce::ConfidentialNonce
            ((ConfidentialNonce *)&gtest_ar.message_,(ByteData *)local_28);
  cfd::core::ConfidentialNonce::GetHex_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_98,"nonce.GetHex().c_str()",
             "\"02c384a78ae89b9600a8d2b4ddb3090ba5dad224ff4b85e6868f2916ca64314ad9\"",pcVar3,
             "02c384a78ae89b9600a8d2b4ddb3090ba5dad224ff4b85e6868f2916ca64314ad9");
  std::__cxx11::string::~string(local_b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialnonce.cpp"
               ,0x62,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  cfd::core::ConfidentialNonce::GetData();
  local_e0 = cfd::core::ByteData::GetDataSize();
  local_fc = 0x21;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((EqHelper<false> *)local_d8,"nonce.GetData().GetDataSize()","33",&local_e0,&local_fc);
  cfd::core::ByteData::~ByteData(&local_f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
  if (!bVar1) {
    testing::Message::Message(&local_108);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialnonce.cpp"
               ,99,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
  bVar2 = cfd::core::ConfidentialNonce::HasBlinding();
  local_121 = (bool)(bVar2 & 1);
  local_122 = true;
  testing::internal::EqHelper<false>::Compare<bool,bool>
            ((EqHelper<false> *)local_120,"nonce.HasBlinding()","true",&local_121,&local_122);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
  if (!bVar1) {
    testing::Message::Message(&local_130);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_120);
    testing::internal::AssertHelper::AssertHelper
              (&local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialnonce.cpp"
               ,100,pcVar3);
    testing::internal::AssertHelper::operator=(&local_138,&local_130);
    testing::internal::AssertHelper::~AssertHelper(&local_138);
    testing::Message::~Message(&local_130);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
  cfd::core::ConfidentialNonce::~ConfidentialNonce((ConfidentialNonce *)&gtest_ar.message_);
  cfd::core::ByteData::~ByteData((ByteData *)local_28);
  return;
}

Assistant:

TEST(ConfidentialNonce, Constractor_bytedata33) {
  // 33byte
  ByteData bytedata(
      "02c384a78ae89b9600a8d2b4ddb3090ba5dad224ff4b85e6868f2916ca64314ad9");
  ConfidentialNonce nonce(bytedata);
  EXPECT_STREQ(
      nonce.GetHex().c_str(),
      "02c384a78ae89b9600a8d2b4ddb3090ba5dad224ff4b85e6868f2916ca64314ad9");
  EXPECT_EQ(nonce.GetData().GetDataSize(), 33);
  EXPECT_EQ(nonce.HasBlinding(), true);
}